

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O0

int LS_Scroll_Floor(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4
                   )

{
  double dy;
  double dx;
  int arg2_local;
  int arg1_local;
  int arg0_local;
  bool backSide_local;
  AActor *it_local;
  line_t *ln_local;
  
  if ((arg3 == 0) || (arg3 == 2)) {
    SetScroller(arg0,sc_floor,-((double)arg1 / 32.0),(double)arg2 / 32.0);
  }
  else {
    SetScroller(arg0,sc_floor,0.0,0.0);
  }
  if (arg3 < 1) {
    SetScroller(arg0,sc_carry,0.0,0.0);
  }
  else {
    SetScroller(arg0,sc_carry,(double)arg1 / 32.0,(double)arg2 / 32.0);
  }
  return 1;
}

Assistant:

FUNC(LS_Scroll_Floor)
// Scroll_Floor (tag, x-move, y-move, s/c)
{
	double dx = arg1 / 32.;
	double dy = arg2 / 32.;

	if (arg3 == 0 || arg3 == 2)
	{
		SetScroller (arg0, EScroll::sc_floor, -dx, dy);
	}
	else
	{
		SetScroller (arg0, EScroll::sc_floor, 0, 0);
	}
	if (arg3 > 0)
	{
		SetScroller (arg0, EScroll::sc_carry, dx, dy);
	}
	else
	{
		SetScroller (arg0, EScroll::sc_carry, 0, 0);
	}
	return true;
}